

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O3

bool __thiscall
duckdb::ArrayLengthBinaryFunctionData::Equals
          (ArrayLengthBinaryFunctionData *this,FunctionData *other)

{
  pointer __s1;
  pointer plVar1;
  int iVar2;
  size_t __n;
  ArrayLengthBinaryFunctionData *other_data;
  
  __s1 = (this->dimensions).super_vector<long,_std::allocator<long>_>.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->dimensions).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  __n = (long)plVar1 - (long)__s1;
  if (__n != (long)other[2]._vptr_FunctionData - (long)other[1]._vptr_FunctionData) {
    return false;
  }
  if (plVar1 != __s1) {
    iVar2 = bcmp(__s1,other[1]._vptr_FunctionData,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool Equals(const FunctionData &other) const override {
		auto &other_data = other.Cast<const ArrayLengthBinaryFunctionData>();
		return dimensions == other_data.dimensions;
	}